

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O0

InlinedFrame ** __thiscall
Memory::AllocateArray<Memory::HeapAllocator,Js::InlinedFrameWalker::InlinedFrame*,false>
          (Memory *this,HeapAllocator *allocator,offset_in_HeapAllocator_to_subr AllocFunc,
          size_t count)

{
  undefined1 auVar1 [16];
  size_t byteSize;
  InlinedFrame **ppIVar2;
  size_t count_local;
  offset_in_HeapAllocator_to_subr AllocFunc_local;
  HeapAllocator *allocator_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = count;
  byteSize = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    byteSize = 0xffffffffffffffff;
  }
  ppIVar2 = (InlinedFrame **)
            new__<Memory::HeapAllocator>
                      (byteSize,(HeapAllocator *)this,(offset_in_HeapAllocator_to_subr)allocator);
  return ppIVar2;
}

Assistant:

inline T * AllocateArray(TAllocator * allocator, char * (TAllocator::*AllocFunc)(size_t), DECLSPEC_GUARD_OVERFLOW size_t count)
{
    if (count == 0 && TAllocator::FakeZeroLengthArray)
    {
#ifdef TRACK_ALLOC
        allocator->ClearTrackAllocInfo();
#endif
        // C++ standard requires allocator to return non-null if it isn't out of memory
        // Just return some small number so we will still AV if someone try to use the memory
        return (T *)ZERO_LENGTH_ARRAY;
    }
    if (nothrow)
    {
        return new (allocator, nothrow, AllocFunc) T[count];
    }
    return new (allocator, AllocFunc) T[count];
}